

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

ssize_t gnu_sparse_10_read(archive_read *a,tar *tar,int64_t *unconsumed)

{
  wchar_t wVar1;
  int64_t iVar2;
  ulong request;
  ulong uVar3;
  long local_58;
  int64_t remaining;
  int64_t to_skip;
  int64_t size;
  int64_t offset;
  long lStack_30;
  wchar_t entries;
  ssize_t bytes_read;
  int64_t *unconsumed_local;
  tar *tar_local;
  archive_read *a_local;
  
  bytes_read = (ssize_t)unconsumed;
  unconsumed_local = (int64_t *)tar;
  tar_local = (tar *)a;
  gnu_clear_sparse_list(tar);
  local_58 = unconsumed_local[0x13];
  iVar2 = gnu_sparse_10_atol((archive_read *)tar_local,(tar *)unconsumed_local,&local_58,
                             (int64_t *)bytes_read);
  offset._4_4_ = (int)iVar2;
  if (-1 < offset._4_4_) {
    do {
      if (offset._4_4_ < 1) {
        offset._4_4_ = offset._4_4_ + -1;
        tar_flush_unconsumed((archive_read *)tar_local,(int64_t *)bytes_read);
        lStack_30 = unconsumed_local[0x13] - local_58;
        request = -lStack_30 & 0x1ff;
        if (local_58 < (long)request) {
          return -0x1e;
        }
        remaining = request;
        uVar3 = __archive_read_consume((archive_read *)tar_local,request);
        if (request == uVar3) {
          return lStack_30 + remaining;
        }
        return -0x1e;
      }
      offset._4_4_ = offset._4_4_ + -1;
      size = gnu_sparse_10_atol((archive_read *)tar_local,(tar *)unconsumed_local,&local_58,
                                (int64_t *)bytes_read);
      if (size < 0) {
        return -0x1e;
      }
      to_skip = gnu_sparse_10_atol((archive_read *)tar_local,(tar *)unconsumed_local,&local_58,
                                   (int64_t *)bytes_read);
      if (to_skip < 0) {
        return -0x1e;
      }
      wVar1 = gnu_add_sparse_entry((archive_read *)tar_local,(tar *)unconsumed_local,size,to_skip);
    } while (wVar1 == L'\0');
  }
  return -0x1e;
}

Assistant:

static ssize_t
gnu_sparse_10_read(struct archive_read *a, struct tar *tar, int64_t *unconsumed)
{
	ssize_t bytes_read;
	int entries;
	int64_t offset, size, to_skip, remaining;

	/* Clear out the existing sparse list. */
	gnu_clear_sparse_list(tar);

	remaining = tar->entry_bytes_remaining;

	/* Parse entries. */
	entries = (int)gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
	if (entries < 0)
		return (ARCHIVE_FATAL);
	/* Parse the individual entries. */
	while (entries-- > 0) {
		/* Parse offset/size */
		offset = gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
		if (offset < 0)
			return (ARCHIVE_FATAL);
		size = gnu_sparse_10_atol(a, tar, &remaining, unconsumed);
		if (size < 0)
			return (ARCHIVE_FATAL);
		/* Add a new sparse entry. */
		if (gnu_add_sparse_entry(a, tar, offset, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}
	/* Skip rest of block... */
	tar_flush_unconsumed(a, unconsumed);
	bytes_read = (ssize_t)(tar->entry_bytes_remaining - remaining);
	to_skip = 0x1ff & -bytes_read;
	/* Fail if tar->entry_bytes_remaing would get negative */
	if (to_skip > remaining)
		return (ARCHIVE_FATAL);
	if (to_skip != __archive_read_consume(a, to_skip))
		return (ARCHIVE_FATAL);
	return ((ssize_t)(bytes_read + to_skip));
}